

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_cell_face_node(REF_GRID ref_grid,REF_INT node)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_INT local_78;
  REF_INT local_74;
  int local_70;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_INT tri_cell;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT face_nodes [4];
  REF_INT face_node;
  REF_INT cell_face;
  REF_INT cell;
  REF_INT item;
  REF_CELL tri;
  REF_CELL tet;
  REF_NODE ref_node;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  ref_cell_00 = ref_grid->cell[3];
  if ((node < 0) || (ref_cell->ref_adj->nnode <= node)) {
    local_70 = -1;
  }
  else {
    local_70 = ref_cell->ref_adj->first[node];
  }
  cell_face = local_70;
  if (local_70 == -1) {
    local_74 = -1;
  }
  else {
    local_74 = ref_cell->ref_adj->item[local_70].ref;
  }
  face_node = local_74;
  do {
    if (cell_face == -1) {
      return 0;
    }
    for (face_nodes[3] = 0; face_nodes[3] < ref_cell->face_per; face_nodes[3] = face_nodes[3] + 1) {
      for (face_nodes[2] = 0; face_nodes[2] < 4; face_nodes[2] = face_nodes[2] + 1) {
        (&cell1)[face_nodes[2]] =
             ref_cell->c2n
             [ref_cell->f2n[face_nodes[2] + face_nodes[3] * 4] + ref_cell->size_per * face_node];
      }
      if ((((ref_node_00->ref_mpi->id == ref_node_00->part[cell1]) ||
           (ref_node_00->ref_mpi->id == ref_node_00->part[cell0])) ||
          (ref_node_00->ref_mpi->id == ref_node_00->part[face_nodes[0]])) ||
         (ref_node_00->ref_mpi->id == ref_node_00->part[face_nodes[1]])) {
        uVar1 = ref_cell_with_face(ref_cell,&cell1,&tri_cell,&ref_private_macro_code_rsb);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x102,"ref_validation_cell_face_node",(ulong)uVar1,"two expected");
          ref_node_location(ref_node_00,cell1);
          ref_node_location(ref_node_00,cell0);
          ref_node_location(ref_node_00,face_nodes[0]);
          ref_node_location(ref_node_00,face_nodes[1]);
          ref_validation_node_cell(ref_cell,cell1);
          ref_validation_node_cell(ref_cell,cell0);
          ref_validation_node_cell(ref_cell,face_nodes[0]);
          return uVar1;
        }
        if ((ref_private_macro_code_rsb == -1) &&
           (uVar1 = ref_cell_with(ref_cell_00,&cell1,&ref_private_macro_code_rsb_1), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x109,"ref_validation_cell_face_node",(ulong)uVar1,"matching tri");
          ref_node_location(ref_node_00,cell1);
          ref_node_location(ref_node_00,cell0);
          ref_node_location(ref_node_00,face_nodes[0]);
          ref_node_location(ref_node_00,face_nodes[1]);
          return uVar1;
        }
      }
    }
    cell_face = ref_cell->ref_adj->item[cell_face].next;
    if (cell_face == -1) {
      local_78 = -1;
    }
    else {
      local_78 = ref_cell->ref_adj->item[cell_face].ref;
    }
    face_node = local_78;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_face_node(REF_GRID ref_grid,
                                                 REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_face;
  REF_INT face_node, face_nodes[4];
  REF_INT cell0, cell1, tri_cell;

  each_ref_cell_having_node(tet, node, item, cell) {
    each_ref_cell_cell_face(tet, cell_face) {
      for (face_node = 0; face_node < 4; face_node++) {
        face_nodes[face_node] = ref_cell_f2n(tet, face_node, cell_face, cell);
      }
      if (ref_node_owned(ref_node, face_nodes[0]) ||
          ref_node_owned(ref_node, face_nodes[1]) ||
          ref_node_owned(ref_node, face_nodes[2]) ||
          ref_node_owned(ref_node, face_nodes[3])) {
        RSB(ref_cell_with_face(tet, face_nodes, &cell0, &cell1), "two expected",
            {
              ref_node_location(ref_node, face_nodes[0]);
              ref_node_location(ref_node, face_nodes[1]);
              ref_node_location(ref_node, face_nodes[2]);
              ref_node_location(ref_node, face_nodes[3]);
              ref_validation_node_cell(tet, face_nodes[0]);
              ref_validation_node_cell(tet, face_nodes[1]);
              ref_validation_node_cell(tet, face_nodes[2]);
            });
        if (REF_EMPTY == cell1) { /* should have tri on other side */
          RSB(ref_cell_with(tri, face_nodes, &tri_cell), "matching tri", {
            ref_node_location(ref_node, face_nodes[0]);
            ref_node_location(ref_node, face_nodes[1]);
            ref_node_location(ref_node, face_nodes[2]);
            ref_node_location(ref_node, face_nodes[3]);
          });
        }
      }
    }
  }

  return REF_SUCCESS;
}